

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::add_segment(CTcEmbedBuilderDbl *this,CTcPrsNode *cur)

{
  _func_int *len;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  CTcPrsNode *pCVar3;
  
  len = (_func_int *)(G_tok->curtok_).text_len_;
  pCVar3 = cur;
  if (len != (_func_int *)0x0) {
    pp_Var2 = (_func_int **)CTcPrsMem::alloc(G_prsmem,0x18);
    p_Var1 = (_func_int *)(G_tok->curtok_).text_;
    *pp_Var2 = (_func_int *)&PTR___cxa_pure_virtual_00358e80;
    pp_Var2[1] = p_Var1;
    pp_Var2[2] = len;
    CTcGenTarg::note_str(G_cg,(size_t)len);
    *pp_Var2 = (_func_int *)&PTR_gen_code_00362cf0;
    pCVar3 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
    pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cur;
    pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var2;
    (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00360400;
  }
  return pCVar3;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {
        /*
         *   Combine the part so far with the next string segment, using a
         *   comma operator.  If the next string segment is empty, there's no
         *   need to add anything for it.  
         */
        size_t len = G_tok->getcur()->get_text_len();
        if (len != 0)
        {
            /* create a node for the new string segment */
            CTcPrsNode *newstr = new CTPNDstr(
                G_tok->getcur()->get_text(), len);
            
            /* combine it into the part so far with a comma operator */
            cur = new CTPNComma(cur, newstr);
        }

        /* return the new combined node */
        return cur;
    }